

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O0

DetachedBuffer * __thiscall
flatbuffers::vector_downward<unsigned_int>::release
          (DetachedBuffer *__return_storage_ptr__,vector_downward<unsigned_int> *this)

{
  bool bVar1;
  Allocator *allocator;
  uint8_t *buf;
  size_t reserved;
  uint8_t *cur;
  uint uVar2;
  vector_downward<unsigned_int> *this_local;
  DetachedBuffer *fb;
  
  allocator = this->allocator_;
  bVar1 = this->own_allocator_;
  buf = this->buf_;
  reserved = this->reserved_;
  cur = this->cur_;
  uVar2 = size(this);
  DetachedBuffer::DetachedBuffer
            (__return_storage_ptr__,allocator,(bool)(bVar1 & 1),buf,reserved,cur,(ulong)uVar2);
  if ((this->own_allocator_ & 1U) != 0) {
    this->allocator_ = (Allocator *)0x0;
    this->own_allocator_ = false;
  }
  this->buf_ = (uint8_t *)0x0;
  clear(this);
  return __return_storage_ptr__;
}

Assistant:

DetachedBuffer release() {
    // allocator ownership (if any) is transferred to DetachedBuffer.
    DetachedBuffer fb(allocator_, own_allocator_, buf_, reserved_, cur_,
                      size());
    if (own_allocator_) {
      allocator_ = nullptr;
      own_allocator_ = false;
    }
    buf_ = nullptr;
    clear();
    return fb;
  }